

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECorrections.cpp
# Opt level: O0

void __thiscall CECorrections::copy_members(CECorrections *this,CECorrections *other)

{
  long in_RSI;
  long in_RDI;
  vector<double,_std::allocator<double>_> *in_stack_00000088;
  vector<double,_std::allocator<double>_> *in_stack_00000090;
  
  std::__cxx11::string::operator=((string *)(in_RDI + 8),(string *)(in_RSI + 8));
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_00000090,
             (vector<int,_std::allocator<int>_> *)in_stack_00000088);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000090,in_stack_00000088);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000090,in_stack_00000088);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000090,in_stack_00000088);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000090,in_stack_00000088);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000090,in_stack_00000088);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x28),(string *)(in_RSI + 0x28));
  std::__cxx11::string::operator=((string *)(in_RDI + 0x48),(string *)(in_RSI + 0x48));
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000090,in_stack_00000088);
  *(undefined8 *)(in_RDI + 0x130) = *(undefined8 *)(in_RSI + 0x130);
  *(undefined8 *)(in_RDI + 0x138) = *(undefined8 *)(in_RSI + 0x138);
  *(undefined8 *)(in_RDI + 0x140) = *(undefined8 *)(in_RSI + 0x140);
  *(undefined8 *)(in_RDI + 0x148) = *(undefined8 *)(in_RSI + 0x148);
  *(undefined8 *)(in_RDI + 0x150) = *(undefined8 *)(in_RSI + 0x150);
  *(undefined8 *)(in_RDI + 0x158) = *(undefined8 *)(in_RSI + 0x158);
  *(undefined8 *)(in_RDI + 0x160) = *(undefined8 *)(in_RSI + 0x160);
  *(undefined8 *)(in_RDI + 0x168) = *(undefined8 *)(in_RSI + 0x168);
  return;
}

Assistant:

void CECorrections::copy_members(const CECorrections& other)
{
    nutation_file_ = other.nutation_file_;
    nutation_mjd_  = other.nutation_mjd_;
    nutation_dut1_ = other.nutation_dut1_;
    nutation_xp_   = other.nutation_xp_;
    nutation_yp_   = other.nutation_yp_;
    nutation_deps_ = other.nutation_deps_;
    nutation_dpsi_ = other.nutation_dpsi_;

    ttut1_file_hist_ = other.ttut1_file_hist_;
    ttut1_file_pred_ = other.ttut1_file_pred_;
    ttut1_delt_      = other.ttut1_delt_;

    // Caching values
    cache_nut_mjd_    = other.cache_nut_mjd_;
    cache_nut_dut1_   = other.cache_nut_dut1_;
    cache_nut_xp_     = other.cache_nut_xp_;
    cache_nut_yp_     = other.cache_nut_yp_;
    cache_nut_deps_   = other.cache_nut_deps_;
    cache_nut_dpsi_   = other.cache_nut_dpsi_;
    cache_ttut1_mjd_  = other.cache_ttut1_mjd_;
    cache_ttut1_delt_ = other.cache_ttut1_delt_;
}